

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O0

void cnn_convolve_no_maxpool_padding_valid_5x5_avx2
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int channel_step)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  __m256i weight_mask_1_00;
  __m256i weight_mask_0_00;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [24];
  undefined1 auVar32 [24];
  undefined1 auVar33 [16];
  int iVar34;
  int in_ECX;
  long lVar35;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  long in_R9;
  float fVar36;
  float fVar37;
  int in_stack_00000008;
  float *input_ptr_1;
  __m128 accum_1;
  float last_column_sum;
  __m128 tmp_reg_4;
  __m128 tmp_reg_3;
  __m128 tmp_reg_2;
  __m128 accum_h;
  __m128 accum_l;
  __m128 tmp_reg_1;
  __m128 tmp_reg_0;
  __m256 accum;
  int row;
  float *input_ptr;
  __m256 accum_src_1;
  __m256 accum_src_0;
  __m256 load_src_1;
  __m256 load_src_0;
  int rem_width;
  int w;
  int v;
  int out_h;
  int u;
  int h;
  int off;
  float weight [5] [8];
  __m256 shuffle_weight [10];
  int k;
  float out_ch_bias;
  int i;
  int kMinWidthFor3_5x5Blocks;
  int kSkipWidthForNextIter;
  __m256i weight_mask_1;
  __m256i weight_mask_0;
  __m256i block1_2;
  __m256i block0_1;
  int kSkipHeight;
  int kSkipWidth;
  int kFilterHeight;
  int kFilterWidth;
  undefined8 local_a50;
  float in_stack_fffffffffffff5b8;
  float in_stack_fffffffffffff5bc;
  float in_stack_fffffffffffff5c0;
  float in_stack_fffffffffffff5c4;
  float in_stack_fffffffffffff5c8;
  float in_stack_fffffffffffff5cc;
  float in_stack_fffffffffffff5d0;
  float in_stack_fffffffffffff5d4;
  float in_stack_fffffffffffff5d8;
  float in_stack_fffffffffffff5dc;
  float in_stack_fffffffffffff5e0;
  float in_stack_fffffffffffff5e4;
  float in_stack_fffffffffffff5e8;
  float in_stack_fffffffffffff5ec;
  float in_stack_fffffffffffff5f0;
  float in_stack_fffffffffffff5f4;
  undefined8 uStack_a08;
  __m256 *in_stack_fffffffffffff608;
  float local_9f0;
  float (*weight_00) [8];
  int in_stack_fffffffffffff624;
  undefined4 in_stack_fffffffffffff628;
  float in_stack_fffffffffffff62c;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_958;
  undefined1 auStack_950 [16];
  int local_92c;
  undefined1 (*local_928) [32];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  int local_89c;
  int local_898;
  int local_894;
  int local_88c;
  int local_888;
  undefined1 local_880 [16];
  float local_870;
  float local_850;
  float local_830;
  float local_810;
  float local_7f0;
  undefined8 local_7e0 [41];
  int local_694;
  float local_690;
  int local_68c;
  undefined4 local_688;
  undefined4 local_684;
  uint32_t local_680 [2];
  uint32_t auStack_678 [2];
  uint32_t auStack_670 [2];
  uint32_t auStack_668 [2];
  uint32_t local_660 [2];
  uint32_t auStack_658 [2];
  uint32_t auStack_650 [2];
  uint32_t auStack_648 [2];
  uint32_t local_640 [2];
  uint32_t auStack_638 [2];
  uint32_t auStack_630 [2];
  uint32_t auStack_628 [2];
  uint32_t local_620 [2];
  uint32_t auStack_618 [2];
  uint32_t auStack_610 [2];
  uint32_t auStack_608 [4];
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  long local_5e8;
  int *local_5e0;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  long local_5c8;
  undefined8 local_5c0;
  uint32_t (*local_5b8) [8];
  undefined8 local_5b0;
  uint32_t (*local_5a8) [8];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 (*local_550) [32];
  undefined1 (*local_548) [32];
  uint32_t local_540 [2];
  uint32_t auStack_538 [2];
  uint32_t auStack_530 [2];
  uint32_t auStack_528 [2];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  uint32_t local_500 [2];
  uint32_t auStack_4f8 [2];
  uint32_t auStack_4f0 [2];
  uint32_t auStack_4e8 [2];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [16];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  __m256 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_5ec = 5;
  local_5f0 = 5;
  local_5f4 = 4;
  local_5f8 = 4;
  local_5a8 = shuffle_src_layer0;
  local_620[0] = 0;
  local_620[1] = 1;
  auStack_618[0] = 2;
  auStack_618[1] = 3;
  auStack_610[0] = 4;
  auStack_610[1] = 4;
  auStack_608[0] = 5;
  auStack_608[1] = 6;
  local_5b0 = 0xc26980;
  local_640[0] = 0;
  local_640[1] = 1;
  auStack_638[0] = 1;
  auStack_638[1] = 2;
  auStack_630[0] = 3;
  auStack_630[1] = 4;
  auStack_628[0] = 5;
  auStack_628[1] = 0;
  local_5b8 = shuffle_weight_layer0;
  local_660[0] = 0;
  local_660[1] = 1;
  auStack_658[0] = 2;
  auStack_658[1] = 3;
  auStack_650[0] = 4;
  auStack_650[1] = 0;
  auStack_648[0] = 1;
  auStack_648[1] = 2;
  local_5c0 = 0xc269c0;
  local_680[0] = 3;
  local_680[1] = 4;
  auStack_678[0] = 0;
  auStack_678[1] = 1;
  auStack_670[0] = 2;
  auStack_670[1] = 3;
  auStack_668[0] = 4;
  auStack_668[1] = 0;
  local_684 = 0xc;
  local_688 = 0xd;
  local_5e8 = in_R9;
  local_5e0 = in_R8;
  local_5d4 = in_ECX;
  local_5d0 = in_EDX;
  local_5cc = in_ESI;
  local_5c8 = in_RDI;
  for (local_68c = out_stride; local_68c < local_5e0[3]; local_68c = cstep + local_68c) {
    local_690 = *(float *)(*(long *)(local_5e0 + 10) + (long)local_68c * 4);
    for (local_694 = 0; local_694 < *local_5e0; local_694 = local_694 + 1) {
      memset(local_880,0,0xa0);
      weight_mask_0_00[0]._4_4_ = in_stack_fffffffffffff5dc;
      weight_mask_0_00[0]._0_4_ = in_stack_fffffffffffff5d8;
      weight_mask_0_00[1]._0_4_ = in_stack_fffffffffffff5e0;
      weight_mask_0_00[1]._4_4_ = in_stack_fffffffffffff5e4;
      weight_mask_0_00[2]._0_4_ = in_stack_fffffffffffff5e8;
      weight_mask_0_00[2]._4_4_ = in_stack_fffffffffffff5ec;
      weight_mask_0_00[3]._0_4_ = in_stack_fffffffffffff5f0;
      weight_mask_0_00[3]._4_4_ = in_stack_fffffffffffff5f4;
      weight_mask_1_00[0]._4_4_ = in_stack_fffffffffffff5bc;
      weight_mask_1_00[0]._0_4_ = in_stack_fffffffffffff5b8;
      weight_mask_1_00[1]._0_4_ = in_stack_fffffffffffff5c0;
      weight_mask_1_00[1]._4_4_ = in_stack_fffffffffffff5c4;
      weight_mask_1_00[2]._0_4_ = in_stack_fffffffffffff5c8;
      weight_mask_1_00[2]._4_4_ = in_stack_fffffffffffff5cc;
      weight_mask_1_00[3]._0_4_ = in_stack_fffffffffffff5d0;
      weight_mask_1_00[3]._4_4_ = in_stack_fffffffffffff5d4;
      prepare_weights_for_5x5_convolve
                ((float *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),
                 in_stack_fffffffffffff624,weight_00,local_9f0._4_4_,in_stack_fffffffffffff608,
                 weight_mask_0_00,weight_mask_1_00);
      local_88c = 0;
      for (local_888 = 0; local_888 < local_5d0 + -4; local_888 = local_888 + 4) {
        iVar34 = local_88c * in_stack_00000008;
        local_894 = 0;
        local_898 = 0;
        for (local_89c = local_5cc; 0xc < local_89c; local_89c = local_89c + -0xc) {
          local_580 = 0;
          uStack_578 = 0;
          uStack_570 = 0;
          uStack_568 = 0;
          local_900 = 0;
          uStack_8f8 = 0;
          uStack_8f0 = 0;
          uStack_8f0._4_4_ = 0.0;
          uStack_8e8 = 0;
          uStack_8e8._4_4_ = 0.0;
          local_5a0 = 0;
          uStack_598 = 0;
          uStack_590 = 0;
          uStack_588 = 0;
          local_920 = 0;
          uStack_918 = 0;
          uStack_910 = 0;
          uStack_908 = 0;
          local_928 = (undefined1 (*) [32])
                      (*(long *)(local_5c8 + (long)local_694 * 8) +
                      (long)(local_888 * local_5d4 + local_898) * 4);
          local_92c = 0;
          while( true ) {
            uVar4 = uStack_428;
            uVar3 = uStack_430;
            fVar37 = uStack_8e8._4_4_;
            fVar36 = uStack_8f0._4_4_;
            uStack_430._0_4_ = (float)uStack_910;
            uStack_430._4_4_ = (float)((ulong)uStack_910 >> 0x20);
            uStack_428._0_4_ = (float)uStack_908;
            uStack_428._4_4_ = (float)((ulong)uStack_908 >> 0x20);
            if (4 < local_92c) break;
            local_548 = local_928;
            auVar31 = *(undefined1 (*) [24])*local_928;
            uStack_4c8 = *(undefined8 *)(*local_928 + 0x18);
            local_550 = (undefined1 (*) [32])(*local_928 + 0x1c);
            auVar32 = *(undefined1 (*) [24])*local_550;
            uStack_508 = *(undefined8 *)(local_928[1] + 0x14);
            local_8c0 = auVar31._0_8_;
            local_4e0 = local_8c0;
            uStack_8b8 = auVar31._8_8_;
            uStack_4d8 = uStack_8b8;
            uStack_8b0 = auVar31._16_8_;
            uStack_4d0 = uStack_8b0;
            local_500[0] = local_620[0];
            local_500[1] = local_620[1];
            auStack_4f8[0] = auStack_618[0];
            auStack_4f8[1] = auStack_618[1];
            auStack_4f0[0] = auStack_610[0];
            auStack_4f0[1] = auStack_610[1];
            auStack_4e8[0] = auStack_608[0];
            auStack_4e8[1] = auStack_608[1];
            auVar1._8_4_ = auStack_618[0];
            auVar1._12_4_ = auStack_618[1];
            auVar1._0_4_ = local_620[0];
            auVar1._4_4_ = local_620[1];
            auVar1._16_4_ = auStack_610[0];
            auVar1._20_4_ = auStack_610[1];
            auVar1._24_4_ = auStack_608[0];
            auVar1._28_4_ = auStack_608[1];
            auVar1 = vpermps_avx2(auVar1,*local_928);
            local_8e0 = auVar32._0_8_;
            local_520 = local_8e0;
            uStack_8d8 = auVar32._8_8_;
            uStack_518 = uStack_8d8;
            uStack_8d0 = auVar32._16_8_;
            uStack_510 = uStack_8d0;
            local_540[0] = local_640[0];
            local_540[1] = local_640[1];
            auStack_538[0] = auStack_638[0];
            auStack_538[1] = auStack_638[1];
            auStack_530[0] = auStack_630[0];
            auStack_530[1] = auStack_630[1];
            auStack_528[0] = auStack_628[0];
            auStack_528[1] = auStack_628[1];
            auVar2._8_4_ = auStack_638[0];
            auVar2._12_4_ = auStack_638[1];
            auVar2._0_4_ = local_640[0];
            auVar2._4_4_ = local_640[1];
            auVar2._16_4_ = auStack_630[0];
            auVar2._20_4_ = auStack_630[1];
            auVar2._24_4_ = auStack_628[0];
            auVar2._28_4_ = auStack_628[1];
            auVar2 = vpermps_avx2(auVar2,*local_550);
            local_8c0 = auVar1._0_8_;
            uVar3 = local_8c0;
            uStack_8b8 = auVar1._8_8_;
            uVar4 = uStack_8b8;
            uStack_8b0 = auVar1._16_8_;
            uVar5 = uStack_8b0;
            uStack_8a8 = auVar1._24_8_;
            uVar6 = uStack_8a8;
            lVar35 = (long)local_92c;
            uVar7 = local_7e0[lVar35 * 4];
            uVar8 = local_7e0[lVar35 * 4 + 1];
            uVar9 = local_7e0[lVar35 * 4 + 2];
            uStack_468 = local_7e0[lVar35 * 4 + 3];
            local_460._0_4_ = auVar1._0_4_;
            local_460._4_4_ = auVar1._4_4_;
            uStack_458._0_4_ = auVar1._8_4_;
            uStack_458._4_4_ = auVar1._12_4_;
            uStack_450._0_4_ = auVar1._16_4_;
            uStack_450._4_4_ = auVar1._20_4_;
            uStack_448._0_4_ = auVar1._24_4_;
            uStack_448._4_4_ = auVar1._28_4_;
            local_480._0_4_ = (float)uVar7;
            local_480._4_4_ = (float)((ulong)uVar7 >> 0x20);
            uStack_478._0_4_ = (float)uVar8;
            uStack_478._4_4_ = (float)((ulong)uVar8 >> 0x20);
            uStack_470._0_4_ = (float)uVar9;
            uStack_470._4_4_ = (float)((ulong)uVar9 >> 0x20);
            local_8c0 = CONCAT44(local_460._4_4_ * local_480._4_4_,
                                 (float)local_460 * (float)local_480);
            uStack_8b8._0_4_ = (float)uStack_458 * (float)uStack_478;
            uStack_8b8._4_4_ = uStack_458._4_4_ * uStack_478._4_4_;
            uStack_8b0._0_4_ = (float)uStack_450 * (float)uStack_470;
            uStack_8b0._4_4_ = uStack_450._4_4_ * uStack_470._4_4_;
            auVar32 = _local_8c0;
            uStack_8a8._0_4_ = (float)uStack_448 * (float)uStack_468;
            uStack_8a8._4_4_ = uStack_448._4_4_;
            auVar27 = _local_8c0;
            local_8e0 = auVar2._0_8_;
            uVar10 = local_8e0;
            uStack_8d8 = auVar2._8_8_;
            uVar11 = uStack_8d8;
            uStack_8d0 = auVar2._16_8_;
            uVar12 = uStack_8d0;
            uStack_8c8 = auVar2._24_8_;
            uVar13 = uStack_8c8;
            lVar35 = (long)(local_92c + 5);
            uVar14 = local_7e0[lVar35 * 4];
            uVar15 = local_7e0[lVar35 * 4 + 1];
            uVar16 = local_7e0[lVar35 * 4 + 2];
            uStack_4a8 = local_7e0[lVar35 * 4 + 3];
            local_4a0._0_4_ = auVar2._0_4_;
            local_4a0._4_4_ = auVar2._4_4_;
            uStack_498._0_4_ = auVar2._8_4_;
            uStack_498._4_4_ = auVar2._12_4_;
            uStack_490._0_4_ = auVar2._16_4_;
            uStack_490._4_4_ = auVar2._20_4_;
            uStack_488._0_4_ = auVar2._24_4_;
            uStack_488._4_4_ = auVar2._28_4_;
            local_4c0._0_4_ = (float)uVar14;
            local_4c0._4_4_ = (float)((ulong)uVar14 >> 0x20);
            uStack_4b8._0_4_ = (float)uVar15;
            uStack_4b8._4_4_ = (float)((ulong)uVar15 >> 0x20);
            uStack_4b0._0_4_ = (float)uVar16;
            uStack_4b0._4_4_ = (float)((ulong)uVar16 >> 0x20);
            local_8e0 = CONCAT44(local_4a0._4_4_ * local_4c0._4_4_,
                                 (float)local_4a0 * (float)local_4c0);
            uStack_8d8._0_4_ = (float)uStack_498 * (float)uStack_4b8;
            uStack_8d8._4_4_ = uStack_498._4_4_ * uStack_4b8._4_4_;
            uStack_8d0._0_4_ = (float)uStack_490 * (float)uStack_4b0;
            uStack_8d0._4_4_ = uStack_490._4_4_ * uStack_4b0._4_4_;
            auVar31 = _local_8e0;
            uStack_8c8._0_4_ = (float)uStack_488 * (float)uStack_4a8;
            uStack_8c8._4_4_ = uStack_488._4_4_;
            auVar1 = _local_8e0;
            local_3e0 = local_8c0;
            uStack_3d8 = uStack_8b8;
            uStack_8b0 = auVar32._16_8_;
            uStack_3d0 = uStack_8b0;
            uStack_8a8 = auVar27._24_8_;
            uStack_3c8 = uStack_8a8;
            uVar17 = local_900;
            uVar18 = uStack_8f8;
            uVar19 = uStack_8f0;
            uVar20 = uStack_8e8;
            local_400._0_4_ = (float)local_900;
            local_400._4_4_ = (float)((ulong)local_900 >> 0x20);
            uStack_3f8._0_4_ = (float)uStack_8f8;
            uStack_3f8._4_4_ = (float)((ulong)uStack_8f8 >> 0x20);
            uStack_3f0._0_4_ = (float)uStack_8f0;
            uStack_3f0._4_4_ = (float)((ulong)uStack_8f0 >> 0x20);
            uStack_3e8._0_4_ = (float)uStack_8e8;
            uStack_3e8._4_4_ = (float)((ulong)uStack_8e8 >> 0x20);
            uStack_8f0._4_4_ = uStack_450._4_4_ * uStack_470._4_4_ + uStack_3f0._4_4_;
            uStack_8e8._4_4_ = uStack_448._4_4_ + uStack_3e8._4_4_;
            local_900 = CONCAT44(local_460._4_4_ * local_480._4_4_ + local_400._4_4_,
                                 (float)local_460 * (float)local_480 + (float)local_400);
            uStack_8f8 = CONCAT44(uStack_458._4_4_ * uStack_478._4_4_ + uStack_3f8._4_4_,
                                  (float)uStack_458 * (float)uStack_478 + (float)uStack_3f8);
            uStack_8f0 = CONCAT44(uStack_8f0._4_4_,
                                  (float)uStack_450 * (float)uStack_470 + (float)uStack_3f0);
            uStack_8e8 = CONCAT44(uStack_8e8._4_4_,
                                  (float)uStack_448 * (float)uStack_468 + (float)uStack_3e8);
            local_420 = local_8e0;
            uStack_418 = uStack_8d8;
            uStack_8d0 = auVar31._16_8_;
            uStack_410 = uStack_8d0;
            uStack_8c8 = auVar1._24_8_;
            uStack_408 = uStack_8c8;
            uVar21 = local_920;
            uVar22 = uStack_918;
            uVar23 = uStack_910;
            uVar24 = uStack_908;
            local_440._0_4_ = (float)local_920;
            local_440._4_4_ = (float)((ulong)local_920 >> 0x20);
            uStack_438._0_4_ = (float)uStack_918;
            uStack_438._4_4_ = (float)((ulong)uStack_918 >> 0x20);
            local_920 = CONCAT44(local_4a0._4_4_ * local_4c0._4_4_ + local_440._4_4_,
                                 (float)local_4a0 * (float)local_4c0 + (float)local_440);
            uStack_918 = CONCAT44(uStack_498._4_4_ * uStack_4b8._4_4_ + uStack_438._4_4_,
                                  (float)uStack_498 * (float)uStack_4b8 + (float)uStack_438);
            uStack_910 = CONCAT44(uStack_490._4_4_ * uStack_4b0._4_4_ + uStack_430._4_4_,
                                  (float)uStack_490 * (float)uStack_4b0 + (float)uStack_430);
            uStack_908 = CONCAT44(uStack_488._4_4_ + uStack_428._4_4_,
                                  (float)uStack_488 * (float)uStack_4a8 + (float)uStack_428);
            local_928 = (undefined1 (*) [32])(*local_928 + (long)local_5d4 * 4);
            local_92c = local_92c + 1;
            local_4c0 = uVar14;
            uStack_4b8 = uVar15;
            uStack_4b0 = uVar16;
            local_4a0 = uVar10;
            uStack_498 = uVar11;
            uStack_490 = uVar12;
            uStack_488 = uVar13;
            local_480 = uVar7;
            uStack_478 = uVar8;
            uStack_470 = uVar9;
            local_460 = uVar3;
            uStack_458 = uVar4;
            uStack_450 = uVar5;
            uStack_448 = uVar6;
            local_440 = uVar21;
            uStack_438 = uVar22;
            uStack_430 = uVar23;
            uStack_428 = uVar24;
            local_400 = uVar17;
            uStack_3f8 = uVar18;
            uStack_3f0 = uVar19;
            uStack_3e8 = uVar20;
          }
          local_3a0 = local_900;
          uStack_398 = uStack_8f8;
          uStack_390 = uStack_8f0;
          uStack_388 = uStack_8e8;
          local_3c0 = local_920;
          uStack_3b8 = uStack_918;
          uStack_3b0 = uStack_910;
          uStack_3a8 = uStack_908;
          auVar28._8_8_ = uStack_8f8;
          auVar28._0_8_ = local_900;
          auVar28._16_8_ = uStack_8f0;
          auVar28._24_8_ = uStack_8e8;
          auVar27._8_8_ = uStack_918;
          auVar27._0_8_ = local_920;
          auVar27._16_8_ = uStack_910;
          auVar27._24_8_ = uStack_908;
          auVar1 = vhaddps_avx(auVar28,auVar27);
          local_2e0 = CONCAT48(fVar36,uStack_8f0);
          auVar33._8_8_ = uStack_8e8;
          auVar33._0_8_ = local_2e0;
          auVar33._12_4_ = fVar37;
          auStack_950 = auVar1._16_16_;
          auVar29 = auStack_950;
          uStack_1d8 = uStack_908;
          local_1e0 = uStack_910;
          uStack_958 = auVar33._8_8_;
          uStack_2d8 = uStack_958;
          auStack_950._0_8_ = auVar1._16_8_;
          uStack_2d0 = auStack_950._0_8_;
          auStack_950._8_8_ = auVar1._24_8_;
          uStack_2c8 = auStack_950._8_8_;
          local_1c0._0_4_ = auVar1._16_4_;
          local_1c0._4_4_ = auVar1._20_4_;
          uStack_1b8._0_4_ = auVar1._24_4_;
          uStack_1b8._4_4_ = auVar1._28_4_;
          local_1f0 = (float)local_9a0;
          fStack_1ec = (float)((ulong)local_9a0 >> 0x20);
          fStack_1e8 = (float)uStack_998;
          fStack_1e4 = (float)((ulong)uStack_998 >> 0x20);
          local_200 = (float)local_980;
          fStack_1fc = (float)((ulong)local_980 >> 0x20);
          fStack_1f8 = (float)uStack_978;
          fStack_1f4 = (float)((ulong)uStack_978 >> 0x20);
          local_140 = CONCAT44(local_1c0._4_4_ + uStack_430._4_4_,
                               (float)local_1c0 + (float)uStack_430);
          uStack_138 = CONCAT44(uStack_1b8._4_4_ + uStack_428._4_4_,
                                (float)uStack_1b8 + (float)uStack_428);
          local_150 = vpermilps_avx(auVar29,1);
          *(float *)(*(long *)(local_5e8 + (long)local_68c * 8) + (long)(iVar34 + local_894) * 4) =
               local_690 + (float)local_1c0 + (float)uStack_430 + (float)local_150._0_4_;
          auVar26._4_4_ = uStack_430._4_4_ + fStack_1ec;
          auVar26._0_4_ = (float)uStack_430 + local_1f0;
          auVar26._8_4_ = (float)uStack_428 + fStack_1e8;
          auVar26._12_4_ = uStack_428._4_4_ + fStack_1e4;
          local_160 = vpermilps_avx(auVar26,1);
          local_170 = vpermilps_avx(auVar29,2);
          *(float *)(*(long *)(local_5e8 + (long)local_68c * 8) + 4 + (long)(iVar34 + local_894) * 4
                    ) = local_690 + (float)local_160._0_4_ + (float)local_170._0_4_;
          auVar25._4_4_ = fStack_1fc + fStack_1ec;
          auVar25._0_4_ = local_200 + local_1f0;
          auVar25._8_4_ = fStack_1f8 + fStack_1e8;
          auVar25._12_4_ = fStack_1f4 + fStack_1e4;
          local_180 = vpermilps_avx(auVar25,2);
          local_190 = vpermilps_avx(auVar29,3);
          *(float *)(*(long *)(local_5e8 + (long)local_68c * 8) + (long)(iVar34 + local_894 + 2) * 4
                    ) = local_690 + (float)local_180._0_4_ + (float)local_190._0_4_;
          local_894 = local_894 + 3;
          local_898 = local_898 + 0xc;
          uStack_430 = uVar3;
          uStack_428 = uVar4;
          local_1d0 = local_1e0;
          uStack_1c8 = uStack_1d8;
          local_1c0 = auStack_950._0_8_;
          uStack_1b8 = auStack_950._8_8_;
        }
        for (; 4 < local_89c; local_89c = local_89c + -4) {
          local_130 = 0;
          uStack_128 = 0;
          local_f8 = (undefined8 *)
                     (*(long *)(local_5c8 + (long)local_694 * 8) +
                     (long)(local_888 * local_5d4 + local_898) * 4);
          uVar3 = *local_f8;
          uStack_58 = local_f8[1];
          local_100 = (undefined8 *)((long)local_f8 + (long)local_5d4 * 4);
          local_80 = *local_100;
          uStack_78 = local_100[1];
          local_108 = (undefined8 *)((long)local_100 + (long)local_5d4 * 4);
          local_a0 = *local_108;
          uStack_98 = local_108[1];
          local_110 = (undefined8 *)((long)local_108 + (long)local_5d4 * 4);
          local_c0 = *local_110;
          uStack_b8 = local_110[1];
          in_stack_fffffffffffff608 = (__m256 *)((long)local_110 + (long)local_5d4 * 4);
          local_e0 = *(undefined8 *)*in_stack_fffffffffffff608;
          uVar4 = *(undefined8 *)(*in_stack_fffffffffffff608 + 2);
          in_stack_fffffffffffff62c =
               (*in_stack_fffffffffffff608)[4] * local_7f0 +
               *(float *)(local_110 + 2) * local_810 +
               *(float *)(local_108 + 2) * local_830 +
               *(float *)(local_100 + 2) * local_850 + *(float *)(local_f8 + 2) * local_870 + 0.0;
          local_60._0_4_ = (float)uVar3;
          local_60._4_4_ = (float)((ulong)uVar3 >> 0x20);
          local_70 = (float)local_7e0[0];
          fStack_6c = (float)((ulong)local_7e0[0] >> 0x20);
          fStack_68 = (float)local_7e0[1];
          fStack_64 = (float)((ulong)local_7e0[1] >> 0x20);
          in_stack_fffffffffffff5b8 = (float)uStack_58 * fStack_68;
          in_stack_fffffffffffff5bc = (float)((ulong)uStack_58 >> 0x20) * fStack_64;
          local_a50 = CONCAT44(local_60._4_4_ * fStack_6c,(float)local_60 * local_70);
          local_90 = (float)local_7e0[4];
          fStack_8c = (float)((ulong)local_7e0[4] >> 0x20);
          fStack_88 = (float)local_7e0[5];
          fStack_84 = (float)((ulong)local_7e0[5] >> 0x20);
          local_90 = (float)local_80 * local_90;
          fStack_8c = (float)((ulong)local_80 >> 0x20) * fStack_8c;
          fStack_88 = (float)uStack_78 * fStack_88;
          fStack_84 = (float)((ulong)uStack_78 >> 0x20) * fStack_84;
          local_b0 = (float)local_7e0[8];
          fStack_ac = (float)((ulong)local_7e0[8] >> 0x20);
          fStack_a8 = (float)local_7e0[9];
          fStack_a4 = (float)((ulong)local_7e0[9] >> 0x20);
          in_stack_fffffffffffff5d0 = (float)local_a0 * local_b0;
          in_stack_fffffffffffff5d4 = (float)((ulong)local_a0 >> 0x20) * fStack_ac;
          in_stack_fffffffffffff5d8 = (float)uStack_98 * fStack_a8;
          in_stack_fffffffffffff5dc = (float)((ulong)uStack_98 >> 0x20) * fStack_a4;
          local_d0 = (float)local_7e0[0xc];
          fStack_cc = (float)((ulong)local_7e0[0xc] >> 0x20);
          fStack_c8 = (float)local_7e0[0xd];
          fStack_c4 = (float)((ulong)local_7e0[0xd] >> 0x20);
          local_d0 = (float)local_c0 * local_d0;
          fStack_cc = (float)((ulong)local_c0 >> 0x20) * fStack_cc;
          fStack_c8 = (float)uStack_b8 * fStack_c8;
          fStack_c4 = (float)((ulong)uStack_b8 >> 0x20) * fStack_c4;
          uStack_d8._0_4_ = (float)uVar4;
          uStack_d8._4_4_ = (float)((ulong)uVar4 >> 0x20);
          local_f0 = (float)local_7e0[0x10];
          fStack_ec = (float)((ulong)local_7e0[0x10] >> 0x20);
          fStack_e8 = (float)local_7e0[0x11];
          fStack_e4 = (float)((ulong)local_7e0[0x11] >> 0x20);
          in_stack_fffffffffffff5f0 = (float)local_e0 * local_f0;
          in_stack_fffffffffffff5f4 = (float)((ulong)local_e0 >> 0x20) * fStack_ec;
          uStack_a08 = CONCAT44(uStack_d8._4_4_ * fStack_e4,(float)uStack_d8 * fStack_e8);
          local_220 = local_a50;
          uStack_218 = CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8);
          local_230 = 0;
          weight_00 = (float (*) [8])0x0;
          uStack_228 = weight_00;
          fVar36 = (float)local_60 * local_70 + 0.0;
          fVar37 = local_60._4_4_ * fStack_6c + 0.0;
          _local_9f0 = CONCAT44(fVar37,fVar36);
          stack0xfffffffffffff618 = in_stack_fffffffffffff5b8 + 0.0;
          stack0xfffffffffffff61c = in_stack_fffffffffffff5bc + 0.0;
          local_240 = CONCAT44(fStack_8c,local_90);
          uStack_238 = CONCAT44(fStack_84,fStack_88);
          local_250 = CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0);
          uStack_248 = CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8);
          local_90 = local_90 + in_stack_fffffffffffff5d0;
          fStack_8c = fStack_8c + in_stack_fffffffffffff5d4;
          fStack_88 = fStack_88 + in_stack_fffffffffffff5d8;
          fStack_84 = fStack_84 + in_stack_fffffffffffff5dc;
          local_260 = CONCAT44(fStack_cc,local_d0);
          uStack_258 = CONCAT44(fStack_c4,fStack_c8);
          local_270 = CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0);
          uStack_268 = uStack_a08;
          in_stack_fffffffffffff5e0 = local_d0 + in_stack_fffffffffffff5f0;
          in_stack_fffffffffffff5e4 = fStack_cc + in_stack_fffffffffffff5f4;
          in_stack_fffffffffffff5e8 = fStack_c8 + (float)uStack_d8 * fStack_e8;
          in_stack_fffffffffffff5ec = fStack_c4 + uStack_d8._4_4_ * fStack_e4;
          local_280 = CONCAT44(fStack_8c,local_90);
          uStack_278 = CONCAT44(fStack_84,fStack_88);
          local_290 = CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0);
          uStack_288 = CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8);
          in_stack_fffffffffffff5c0 = local_90 + in_stack_fffffffffffff5e0;
          in_stack_fffffffffffff5c4 = fStack_8c + in_stack_fffffffffffff5e4;
          in_stack_fffffffffffff5c8 = fStack_88 + in_stack_fffffffffffff5e8;
          in_stack_fffffffffffff5cc = fStack_84 + in_stack_fffffffffffff5ec;
          local_2a0 = _local_9f0;
          uStack_298 = weight_00;
          local_2b0 = CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0);
          uStack_2a8 = CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8);
          _local_9f0 = CONCAT44(fVar37 + in_stack_fffffffffffff5c4,
                                fVar36 + in_stack_fffffffffffff5c0);
          stack0xfffffffffffff618 = in_stack_fffffffffffff5b8 + 0.0 + in_stack_fffffffffffff5c8;
          stack0xfffffffffffff61c = in_stack_fffffffffffff5bc + 0.0 + in_stack_fffffffffffff5cc;
          local_50 = _local_9f0;
          uStack_48 = weight_00;
          auVar30._8_8_ = weight_00;
          auVar30._0_8_ = _local_9f0;
          auVar29._8_8_ = weight_00;
          auVar29._0_8_ = _local_9f0;
          _local_9f0 = vhaddps_avx(auVar30,auVar29);
          local_1a0._0_4_ = local_9f0;
          local_1b0 = vpermilps_avx(_local_9f0,1);
          *(float *)(*(long *)(local_5e8 + (long)local_68c * 8) + (long)(iVar34 + local_894) * 4) =
               local_690 + in_stack_fffffffffffff62c + (float)local_1a0 + (float)local_1b0._0_4_;
          local_894 = local_894 + 1;
          local_898 = local_898 + 4;
          local_1a0 = _local_9f0;
          uStack_198 = weight_00;
          local_118 = in_stack_fffffffffffff608;
          uStack_d8 = uVar4;
          local_60 = uVar3;
          local_40 = local_50;
          uStack_38 = uStack_48;
        }
        local_88c = local_88c + 1;
      }
    }
  }
  return;
}

Assistant:

static void cnn_convolve_no_maxpool_padding_valid_5x5_avx2(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *const layer_config, float **output, int out_stride,
    int start_idx, const int cstep, const int channel_step) {
  const int kFilterWidth = 5;
  const int kFilterHeight = 5;
  const int kSkipWidth = 4;
  const int kSkipHeight = 4;
  assert(layer_config->filter_width == kFilterWidth &&
         layer_config->filter_height == kFilterHeight);
  assert(layer_config->skip_width == kSkipWidth &&
         layer_config->skip_height == kSkipHeight);

  // Load shuffle buffers needed for source.
  const __m256i block0_1 =
      _mm256_load_si256((const __m256i *)shuffle_src_layer0[0]);
  const __m256i block1_2 =
      _mm256_load_si256((const __m256i *)shuffle_src_layer0[1]);

  // Load shuffle buffers needed for weight.
  const __m256i weight_mask_0 =
      _mm256_load_si256((const __m256i *)shuffle_weight_layer0[0]);
  const __m256i weight_mask_1 =
      _mm256_load_si256((const __m256i *)shuffle_weight_layer0[1]);

  // Width needs to be moved to go to next iteration of processing 3 5x5 blocks.
  const int kSkipWidthForNextIter = kSkipWidth * 3;

  // Minimum width required to process 3 5x5 blocks at a time.
  // min width (for processing 3 5x5 block) = 2*skip_width + filter_width
  // Here, skip_width specifies how much width we should move while processing
  // next block convolution and filter_width specifies for how many pixels
  // filter needs to be applied.
  const int kMinWidthFor3_5x5Blocks = (kSkipWidth * 2) + kFilterWidth;
  for (int i = start_idx; i < layer_config->out_channels; i += channel_step) {
    const float out_ch_bias = layer_config->bias[i];
    for (int k = 0; k < layer_config->in_channels; ++k) {
      __m256 shuffle_weight[10];

      // Weights needed are 5x5, for SIMD purpose made this array as 5x8.
      float weight[5][8] = { { 0 } };
      int off = k * layer_config->out_channels + i;

      // In layer 0, the convolution process happens at 5x5.
      // The weights needed for 5x5 block are same across the in-channels,
      // which is why the load of weights happens once for each in-channel.
      prepare_weights_for_5x5_convolve(layer_config->weights, off, weight,
                                       cstep, shuffle_weight, weight_mask_0,
                                       weight_mask_1);

      for (int h = 0, u = 0; h < in_height - kFilterHeight + 1;
           h += kSkipHeight, ++u) {
        const int out_h = u * out_stride;
        int v = 0;
        int w = 0;
        int rem_width = in_width;
        // Processing 3 5x5 blocks at a time, if sufficient width is present.
        while (rem_width >= kMinWidthFor3_5x5Blocks) {
          __m256 load_src_0, load_src_1;
          __m256 accum_src_0 = _mm256_setzero_ps();
          __m256 accum_src_1 = _mm256_setzero_ps();
          const float *input_ptr = &input[k][h * in_stride + w];
          PERFORM_CONVOLVE_FOR_3_5X5_BLOCKS();

          // Accumulate across column.
          __m256 accum = _mm256_hadd_ps(accum_src_0, accum_src_1);
          __m128 tmp_reg_0 = _mm256_extractf128_ps(accum_src_0, 1);
          __m128 tmp_reg_1 = _mm256_extractf128_ps(accum_src_1, 1);

          __m128 accum_l = _mm256_castps256_ps128(accum);
          __m128 accum_h = _mm256_extractf128_ps(accum, 1);

          __m128 tmp_reg_2 = _mm_add_ps(accum_l, tmp_reg_0);
          __m128 tmp_reg_3 = _mm_add_ps(tmp_reg_0, accum_h);
          __m128 tmp_reg_4 = _mm_add_ps(tmp_reg_1, accum_h);

          // 1st 5x5 block output.
          output[i][out_h + v] =
              out_ch_bias + _mm_cvtss_f32(tmp_reg_2) +
              _mm_cvtss_f32(_mm_shuffle_ps(accum_l, accum_l, 1));

          // 2nd 5x5 block output.
          output[i][out_h + v + 1] =
              out_ch_bias +
              _mm_cvtss_f32(_mm_shuffle_ps(tmp_reg_3, tmp_reg_3, 1)) +
              _mm_cvtss_f32(_mm_shuffle_ps(accum_l, accum_l, 2));

          // 3rd 5x5 block output.
          output[i][out_h + v + 2] =
              out_ch_bias +
              _mm_cvtss_f32(_mm_shuffle_ps(tmp_reg_4, tmp_reg_4, 2)) +
              _mm_cvtss_f32(_mm_shuffle_ps(accum_l, accum_l, 3));

          v += 3;
          w += kSkipWidthForNextIter;
          rem_width -= kSkipWidthForNextIter;
        }

        // Process remaining blocks as single 5x5 block at a time.
        while (rem_width >= kFilterWidth) {
          float last_column_sum = 0;
          __m128 accum = _mm_setzero_ps();
          const float *input_ptr = &input[k][h * in_stride + w];
          PERFORM_CONVOLVE_FOR_1_5X5_BLOCK(shuffle_weight, accum, in_stride);

          // Accumulate across column.
          accum = _mm_hadd_ps(accum, accum);
          output[i][out_h + v] = out_ch_bias + last_column_sum +
                                 _mm_cvtss_f32(accum) +
                                 _mm_cvtss_f32(_mm_shuffle_ps(accum, accum, 1));

          v += 1;
          w += kSkipWidth;
          rem_width -= kSkipWidth;
        }
      }
    }
  }
}